

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O0

void anon_unknown.dwarf_e7258::readWriteTestWithAbsoluateCoordinates
               (int channelCount,int testTimes,string *tempDir)

{
  ostream *poVar1;
  void *pvVar2;
  char *pcVar3;
  int in_ESI;
  int in_EDI;
  Compression compression;
  int compressionIndex;
  int i;
  string fn;
  string *in_stack_000009a8;
  undefined1 in_stack_000009b1;
  undefined1 in_stack_000009b2;
  undefined1 in_stack_000009b3;
  int in_stack_000009b4;
  string *in_stack_00000a50;
  undefined1 in_stack_00000a5e;
  undefined1 in_stack_00000a5f;
  Compression in_stack_00000a60;
  int in_stack_00000a64;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar4;
  string local_30 [40];
  int local_8;
  int local_4;
  
  local_8 = in_ESI;
  local_4 = in_EDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing files with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1," channels, using absolute coordinates ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1," times.");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (iVar4 = 0; iVar4 < local_8; iVar4 = iVar4 + 1) {
    generateRandomFile(in_stack_00000a64,in_stack_00000a60,(bool)in_stack_00000a5f,
                       (bool)in_stack_00000a5e,in_stack_00000a50);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
    generateRandomFile(in_stack_00000a64,in_stack_00000a60,(bool)in_stack_00000a5f,
                       (bool)in_stack_00000a5e,in_stack_00000a50);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
    generateRandomFile(in_stack_00000a64,in_stack_00000a60,(bool)in_stack_00000a5f,
                       (bool)in_stack_00000a5e,in_stack_00000a50);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    readFile(in_stack_000009b4,(bool)in_stack_000009b3,(bool)in_stack_000009b2,
             (bool)in_stack_000009b1,in_stack_000009a8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    remove(pcVar3);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
readWriteTestWithAbsoluateCoordinates (
    int channelCount, int testTimes, const std::string& tempDir)
{
    cout << "Testing files with " << channelCount
         << " channels, using absolute coordinates " << testTimes << " times."
         << endl
         << flush;

    std::string fn = tempDir + "imf_test_deep_tiled_basic.exr";

    for (int i = 0; i < testTimes; i++)
    {
        int         compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0: compression = NO_COMPRESSION; break;
            case 1: compression = RLE_COMPRESSION; break;
            case 2: compression = ZIPS_COMPRESSION; break;
        }

        generateRandomFile (channelCount, compression, false, false, fn);
        readFile (channelCount, false, false, false, fn);
        readFile (channelCount, false, false, true, fn);
        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, true, false, fn);
        readFile (channelCount, true, false, false, fn);
        readFile (channelCount, true, false, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;

        generateRandomFile (channelCount, compression, false, true, fn);
        readFile (channelCount, false, true, false, fn);
        readFile (channelCount, false, true, true, fn);

        remove (fn.c_str ());
        cout << endl << flush;
    }
}